

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

ai_real Assimp::ComputePositionEpsilon(aiMesh **pMeshes,size_t num)

{
  size_t a;
  size_t sVar1;
  float fVar2;
  float fVar3;
  aiVector3t<float> aVar4;
  aiVector3t<float> local_70;
  aiVector3t<float> local_60;
  aiVector3t<float> local_50;
  aiVector3t<float> local_40;
  
  if (pMeshes != (aiMesh **)0x0) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    local_60.z = -1e+10;
    local_60.x = -1e+10;
    local_60.y = -1e+10;
    local_70.z = 1e+10;
    local_70.x = 1e+10;
    local_70.y = 1e+10;
    fVar3 = -1e+10;
    aVar4.z = -1e+10;
    aVar4.x = -1e+10;
    aVar4.y = 0.0;
    for (sVar1 = 0; num != sVar1; sVar1 = sVar1 + 1) {
      ArrayBounds<aiVector3t<float>>
                (pMeshes[sVar1]->mVertices,pMeshes[sVar1]->mNumVertices,&local_40,&local_50);
      local_70 = std::min<float>(&local_70,&local_40);
      aVar4 = std::max<float>(&local_60,&local_50);
      fVar3 = aVar4.y;
      local_60 = aVar4;
    }
    fVar2 = aVar4.x - local_70.x;
    local_70.z = aVar4.z - local_70.z;
    return SQRT(local_70.z * local_70.z +
                fVar2 * fVar2 + (fVar3 - local_70.y) * (fVar3 - local_70.y)) * 0.0001;
  }
  __assert_fail("__null != pMeshes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ProcessHelper.cpp"
                ,0xa0,"ai_real Assimp::ComputePositionEpsilon(const aiMesh *const *, size_t)");
}

Assistant:

ai_real ComputePositionEpsilon(const aiMesh* const* pMeshes, size_t num)
{
    ai_assert( NULL != pMeshes );

    const ai_real epsilon = ai_real( 1e-4 );

    // calculate the position bounds so we have a reliable epsilon to check position differences against
    aiVector3D minVec, maxVec, mi, ma;
    MinMaxChooser<aiVector3D>()(minVec,maxVec);

    for (size_t a = 0; a < num; ++a) {
        const aiMesh* pMesh = pMeshes[a];
        ArrayBounds(pMesh->mVertices,pMesh->mNumVertices,mi,ma);

        minVec = std::min(minVec,mi);
        maxVec = std::max(maxVec,ma);
    }
    return (maxVec - minVec).Length() * epsilon;
}